

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coomatrix.h
# Opt level: O0

void __thiscall
lf::assemble::COOMatrix<double>::
MatVecMult<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
          (COOMatrix<double> *this,double alpha,Matrix<double,__1,_1,_0,__1,_1> *vec,
          Matrix<double,__1,_1,_0,__1,_1> *resvec)

{
  double dVar1;
  double dVar2;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_00;
  Matrix<double,__1,_1,_0,__1,_1> *this_01;
  Matrix<double,__1,_1,_0,__1,_1> *pMVar3;
  bool bVar4;
  Index IVar5;
  ostream *poVar6;
  reference this_02;
  double *pdVar7;
  int *piVar8;
  CoeffReturnType pdVar9;
  Scalar *pSVar10;
  Triplet *trp;
  const_iterator __end0;
  const_iterator __begin0;
  TripletVec *__range3;
  string local_510;
  allocator<char> local_4e9;
  string local_4e8;
  allocator<char> local_4c1;
  string local_4c0;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  stringstream local_430 [8];
  stringstream ss_1;
  ostream local_420 [383];
  allocator<char> local_2a1;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [376];
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_28;
  Matrix<double,__1,_1,_0,__1,_1> *resvec_local;
  Matrix<double,__1,_1,_0,__1,_1> *vec_local;
  double alpha_local;
  COOMatrix<double> *this_local;
  
  local_28 = (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)resvec;
  resvec_local = vec;
  vec_local = (Matrix<double,__1,_1,_0,__1,_1> *)alpha;
  alpha_local = (double)this;
  IVar5 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)vec);
  if (IVar5 < (long)(ulong)this->cols_) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar6 = std::operator<<(local_1a0,"Vector vec size mismatch: ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->cols_);
    poVar6 = std::operator<<(poVar6," <-> ");
    IVar5 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                      ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)resvec_local);
    std::ostream::operator<<(poVar6,IVar5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"vec.size() >= cols_",&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/coomatrix.h"
               ,&local_209);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1e0,&local_208,0xfd,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"false",&local_251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/coomatrix.h"
               ,&local_279);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"",&local_2a1);
    lf::base::AssertionFailed(&local_250,&local_278,0xfd,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator(&local_2a1);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
    abort();
  }
  IVar5 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size(local_28);
  if (IVar5 < (long)(ulong)this->rows_) {
    std::__cxx11::stringstream::stringstream(local_430);
    poVar6 = std::operator<<(local_420,"Vector result size mismatch: ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->cols_);
    poVar6 = std::operator<<(poVar6," <-> ");
    IVar5 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size(local_28);
    std::ostream::operator<<(poVar6,IVar5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_450,"resvec.size() >= rows_",&local_451);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_478,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/coomatrix.h"
               ,&local_479);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_450,&local_478,0x100,&local_4a0);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_478);
    std::allocator<char>::~allocator(&local_479);
    std::__cxx11::string::~string((string *)&local_450);
    std::allocator<char>::~allocator(&local_451);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c0,"false",&local_4c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4e8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/coomatrix.h"
               ,&local_4e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_510,"",(allocator<char> *)((long)&__range3 + 7));
    lf::base::AssertionFailed(&local_4c0,&local_4e8,0x100,&local_510);
    std::__cxx11::string::~string((string *)&local_510);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
    std::__cxx11::string::~string((string *)&local_4e8);
    std::allocator<char>::~allocator(&local_4e9);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::allocator<char>::~allocator(&local_4c1);
    abort();
  }
  __end0 = std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>::
           begin(&this->triplets_);
  trp = (Triplet *)
        std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>::end
                  (&this->triplets_);
  while( true ) {
    bVar4 = __gnu_cxx::
            operator==<const_Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                      (&__end0,(__normal_iterator<const_Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                                *)&trp);
    if (((bVar4 ^ 0xffU) & 1) == 0) break;
    this_02 = __gnu_cxx::
              __normal_iterator<const_Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
              ::operator*(&__end0);
    pdVar7 = Eigen::Triplet<double,_int>::value(this_02);
    pMVar3 = vec_local;
    this_01 = resvec_local;
    dVar1 = *pdVar7;
    piVar8 = Eigen::Triplet<double,_int>::col(this_02);
    pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)this_01,
                        (long)*piVar8);
    this_00 = local_28;
    dVar2 = *pdVar9;
    piVar8 = Eigen::Triplet<double,_int>::row(this_02);
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                         (long)*piVar8);
    *pSVar10 = dVar1 * (double)pMVar3 * dVar2 + *pSVar10;
    __gnu_cxx::
    __normal_iterator<const_Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void COOMatrix<SCALAR>::MatVecMult(SCALAR alpha, const VECTOR &vec,
                                   RESULTVECTOR &resvec) const {
  LF_ASSERT_MSG(vec.size() >= cols_,
                "Vector vec size mismatch: " << cols_ << " <-> " << vec.size());
  LF_ASSERT_MSG(
      resvec.size() >= rows_,
      "Vector result size mismatch: " << cols_ << " <-> " << resvec.size());
  for (const Triplet &trp : triplets_) {
    resvec[trp.row()] += trp.value() * (alpha * vec[trp.col()]);
  }
}